

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O1

void __thiscall
capnp::JsonCodec::AnnotatedHandler::FlattenedField::FlattenedField
          (FlattenedField *this,StringPtr prefix,StringPtr name,
          OneOf<capnp::StructSchema::Field,_capnp::Type> *type,Reader *value)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  char *pcVar8;
  long lVar9;
  size_t sVar10;
  ArrayPtr<const_char> local_48;
  char *local_38;
  long local_30;
  
  sVar10 = name.content.size_;
  pcVar8 = name.content.ptr;
  lVar9 = prefix.content.size_ - 1;
  if (lVar9 == 0) {
    (this->ownName).content.ptr = (char *)0x0;
    (this->ownName).content.size_ = 0;
    (this->ownName).content.disposer = (ArrayDisposer *)0x0;
  }
  else {
    local_48.size_ = sVar10 - 1;
    local_48.ptr = pcVar8;
    local_38 = prefix.content.ptr;
    local_30 = lVar9;
    kj::_::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
              (&this->ownName,(_ *)&local_38,&local_48,(ArrayPtr<const_char> *)local_48.size_);
    sVar10 = (this->ownName).content.size_;
    if (sVar10 == 0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = (this->ownName).content.ptr;
    }
    sVar10 = sVar10 + (sVar10 == 0);
  }
  (this->name).content.ptr = pcVar8;
  (this->name).content.size_ = sVar10;
  (this->type).tag = type->tag;
  if (type->tag == 1) {
    uVar1 = *(undefined8 *)&type->field_1;
    uVar2 = *(undefined8 *)((long)&type->field_1 + 8);
    uVar3 = *(undefined8 *)((long)&type->field_1 + 0x10);
    uVar4 = *(undefined8 *)((long)&type->field_1 + 0x18);
    uVar5 = *(undefined8 *)((long)&type->field_1 + 0x20);
    uVar6 = *(undefined8 *)((long)&type->field_1 + 0x28);
    uVar7 = *(undefined8 *)((long)&type->field_1 + 0x38);
    *(undefined8 *)((long)&(this->type).field_1 + 0x30) =
         *(undefined8 *)((long)&type->field_1 + 0x30);
    *(undefined8 *)((long)&(this->type).field_1 + 0x38) = uVar7;
    *(undefined8 *)((long)&(this->type).field_1 + 0x20) = uVar5;
    *(undefined8 *)((long)&(this->type).field_1 + 0x28) = uVar6;
    *(undefined8 *)((long)&(this->type).field_1 + 0x10) = uVar3;
    *(undefined8 *)((long)&(this->type).field_1 + 0x18) = uVar4;
    *(undefined8 *)&(this->type).field_1 = uVar1;
    *(undefined8 *)((long)&(this->type).field_1 + 8) = uVar2;
  }
  if (type->tag == 2) {
    uVar1 = *(undefined8 *)((long)&type->field_1 + 8);
    *(undefined8 *)&(this->type).field_1 = *(undefined8 *)&type->field_1;
    *(undefined8 *)((long)&(this->type).field_1 + 8) = uVar1;
  }
  DynamicValue::Reader::Reader(&this->value,value);
  return;
}

Assistant:

FlattenedField(kj::StringPtr prefix, kj::StringPtr name,
                   kj::OneOf<StructSchema::Field, Type> type, DynamicValue::Reader value)
        : ownName(prefix.size() > 0 ? kj::str(prefix, name) : nullptr),
          name(prefix.size() > 0 ? ownName : name),
          type(type), value(value) {}